

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O0

bool __thiscall llvm::APInt::isSubsetOfSlowCase(APInt *this,APInt *RHS)

{
  uint uVar1;
  uint local_24;
  uint e;
  uint i;
  APInt *RHS_local;
  APInt *this_local;
  
  local_24 = 0;
  uVar1 = getNumWords(this);
  while( true ) {
    if (local_24 == uVar1) {
      return true;
    }
    if (((this->U).pVal[local_24] & ((RHS->U).pVal[local_24] ^ 0xffffffffffffffff)) != 0) break;
    local_24 = local_24 + 1;
  }
  return false;
}

Assistant:

bool APInt::isSubsetOfSlowCase(const APInt &RHS) const {
  for (unsigned i = 0, e = getNumWords(); i != e; ++i)
    if ((U.pVal[i] & ~RHS.U.pVal[i]) != 0)
      return false;

  return true;
}